

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<float>::Resize(RepeatedField<float> *this,int new_size,float *value)

{
  float fVar1;
  int iVar2;
  LogMessage *other;
  float *pfVar3;
  float *pfVar4;
  LogMessage local_68;
  LogFinisher local_29;
  
  if (new_size < 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/repeated_field.h"
               ,0x506);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: (new_size) >= (0): ");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (this->current_size_ < new_size) {
    Reserve(this,new_size);
    pfVar3 = elements(this);
    iVar2 = this->current_size_;
    pfVar4 = elements(this);
    fVar1 = *value;
    for (pfVar3 = pfVar3 + iVar2; pfVar3 != pfVar4 + new_size; pfVar3 = pfVar3 + 1) {
      *pfVar3 = fVar1;
    }
  }
  this->current_size_ = new_size;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}